

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O1

void eig22(double *A,int stride,double *eigre,double *eigim)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  
  dVar3 = *A;
  dVar2 = A[1];
  dVar4 = A[stride];
  dVar8 = A[(long)stride + 1];
  dVar7 = dVar2 + dVar4;
  if ((dVar7 != 0.0) || (NAN(dVar7))) {
    dVar9 = (dVar3 - dVar8) / dVar7;
    dVar5 = dVar9 * dVar9 + 1.0;
    if (dVar5 < 0.0) {
      dVar5 = sqrt(dVar5);
    }
    else {
      dVar5 = SQRT(dVar5);
    }
    dVar9 = dVar9 / (dVar5 + 1.0);
    dVar5 = dVar9 * dVar9 + 1.0;
    if (dVar5 < 0.0) {
      dVar5 = sqrt(dVar5);
    }
    else {
      dVar5 = SQRT(dVar5);
    }
    dVar5 = 1.0 / dVar5;
    dVar9 = dVar9 * dVar5;
  }
  else {
    dVar9 = 0.7071067811865475;
    dVar5 = 0.7071067811865475;
  }
  dVar1 = dVar9 * dVar9;
  dVar6 = dVar5 * dVar5;
  dVar7 = (dVar6 * dVar3 + dVar8 * dVar1) - dVar7 * dVar9 * dVar5;
  dVar8 = (dVar3 - dVar8) * dVar9 * dVar5;
  dVar5 = (dVar6 * dVar2 - dVar4 * dVar1) + dVar8;
  dVar8 = (dVar6 * dVar4 - dVar1 * dVar2) + dVar8;
  eigre[1] = dVar7;
  *eigre = dVar7;
  dVar4 = -dVar5 * dVar8;
  dVar3 = SQRT(dVar4);
  dVar2 = dVar3;
  if (dVar4 < 0.0) {
    dVar2 = sqrt(dVar4);
  }
  *eigim = dVar2;
  if (dVar4 < 0.0) {
    dVar3 = sqrt(dVar4);
  }
  eigim[1] = -dVar3;
  if (0.0 <= dVar5 * dVar8) {
    dVar3 = 0.0;
    if ((dVar5 != 0.0) || (NAN(dVar5))) {
      dVar3 = dVar8 / dVar5;
      if (dVar3 < 0.0) {
        dVar3 = sqrt(dVar3);
      }
      else {
        dVar3 = SQRT(dVar3);
      }
      dVar3 = dVar3 / (dVar3 * dVar3 + 1.0);
    }
    dVar3 = (dVar5 + dVar8) * dVar3;
    *eigim = 0.0;
    eigim[1] = 0.0;
    *eigre = dVar7 - dVar3;
    eigre[1] = dVar3 + dVar7;
  }
  return;
}

Assistant:

void eig22(double *A, int stride,double *eigre,double *eigim) {
	int N;
	double a11,a12,a21,a22,c,s,c2,s2,cs,t1,t,t2,at11,at12,at21,at22;
	N = stride;
	
	a11 = A[0];
	a12 = A[1];
	a21 = A[N];
	a22 = A[N+1];
	
	if ( (a12 + a21) == 0) {
		c = 1./sqrt(2.0);
		s = c;
	} else {
		t1 = (a11 - a22) / (a12 + a21);
		t = t1 /(1. + sqrt(1+t1*t1));
		c = 1./sqrt(1 + t*t);
		s = c*t;
	}
	
	c2 = c*c;
	s2 = s*s;
	cs = c*s;

	at11 = c2 * a11 + s2 * a22 - cs * (a12 + a21);
	at12 = c2 * a12 - s2 * a21 + cs * (a11 - a22);
	at21 = c2 * a21 - s2 * a12 + cs * (a11 - a22);
	at22 = c2 * a22 + s2 * a11 + cs * (a12 + a21);
	
	eigre[0] = eigre[1] = at11;
	eigim[0] = sqrt(-at12 * at21);
	eigim[1] = -sqrt(-at12 * at21);
	
	if ( at12*at21 >= 0) {
		if (at12 == 0) {
			c = 0;
			s = 1;
			c2 = 0;
			s2 = 1;
			cs = 0;
		} else {
			t = sqrt(at21/at12);
			t2 = t * t;
			cs = t/(1+t2);
			c2 = (1+t2);
			s2 = t2 /(1+t2);
		}
		eigim[0] = eigim[1] = 0.0;
		eigre[0] = at11 - cs * (at12 + at21);
		eigre[1] = at11 + cs * (at12 + at21);
		
	}
	
}